

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorCommon.cxx
# Opt level: O1

bool cmQtAutoGeneratorCommon::RccListInputs
               (string *qtMajorVersion,string *rccCommand,string *fileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,string *errorMessage)

{
  uint uVar1;
  string *this;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  istream *piVar8;
  ostream *poVar9;
  char *__s;
  string rccStdErr;
  string eline;
  string rccStdOut;
  string tag;
  int retVal;
  string rccStdErr_1;
  string rccStdOut_1;
  string local_468;
  string local_448;
  undefined1 local_428 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  string *local_3e8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_3e0;
  int local_3d8;
  undefined4 uStack_3d4;
  long local_3c8 [2];
  undefined1 local_3b8 [8];
  pointer pbStack_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [4];
  char *local_360;
  ios_base local_348 [72];
  char *local_300;
  undefined1 local_238 [8];
  char *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  uint auStack_218 [14];
  char *local_1e0;
  ios_base local_1c8 [8];
  ios_base local_1c0 [64];
  char *local_180;
  
  local_3e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  bVar2 = cmsys::SystemTools::FileExists((fileName->_M_dataplus)._M_p);
  if (!bVar2) {
    if (errorMessage != (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"AutoRcc: Error: Rcc file does not exist:\n",0x29);
      Quoted((string *)local_3b8,fileName);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_238,(char *)local_3b8,(long)pbStack_3b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if (local_3b8 != (undefined1  [8])local_3a8) {
        operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)errorMessage,(string *)local_3b8);
      if (local_3b8 != (undefined1  [8])local_3a8) {
        operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      std::ios_base::~ios_base(local_1c8);
    }
    return false;
  }
  iVar5 = std::__cxx11::string::compare((char *)qtMajorVersion);
  if (iVar5 == 0) {
    local_428._0_8_ = local_428 + 0x10;
    local_428._8_8_ = (pointer)0x0;
    local_428._16_8_ = local_428._16_8_ & 0xffffffffffffff00;
    std::ifstream::ifstream(local_238,(fileName->_M_dataplus)._M_p,_S_in);
    uVar1 = *(uint *)((long)auStack_218 + *(long *)((long)local_238 + -0x18));
    bVar2 = (uVar1 & 5) == 0;
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
      std::ostream::operator<<(local_3b8,(streambuf *)local_228._M_local_buf);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)local_428,(string *)&local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,
                        CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                 local_468.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
      std::ios_base::~ios_base(local_348);
    }
    else if (errorMessage != (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b8,"AutoRcc: Error: Rcc file not readable:\n",0x27);
      Quoted(&local_468,fileName);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3b8,local_468._M_dataplus._M_p,local_468._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,
                        CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                 local_468.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,
                        CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                 local_468.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
      std::ios_base::~ios_base(local_348);
    }
    std::ifstream::~ifstream(local_238);
    if ((uVar1 & 5) == 0) {
      cmsys::SystemTools::GetFilenamePath(&local_468,fileName);
      if (local_468._M_string_length != 0) {
        std::__cxx11::string::push_back((char)&local_468);
      }
      local_180 = (char *)0x0;
      cmsys::RegularExpression::compile((RegularExpression *)local_238,"(<file[^<]+)");
      local_300 = (char *)0x0;
      cmsys::RegularExpression::compile((RegularExpression *)local_3b8,"(^<file[^>]*>)");
      lVar6 = 0;
      while (bVar4 = cmsys::RegularExpression::find
                               ((RegularExpression *)local_238,(char *)(local_428._0_8_ + lVar6)),
            bVar4) {
        if (local_230 == (char *)0x0) {
          local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
          local_448._M_string_length = 0;
          local_448.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,local_230,local_1e0);
        }
        lVar6 = lVar6 + local_448._M_string_length;
        cmsys::RegularExpression::find((RegularExpression *)local_3b8,local_448._M_dataplus._M_p);
        local_408._M_allocated_capacity = (size_type)&local_3f8;
        if (pbStack_3b0 == (pointer)0x0) {
          local_408._8_8_ = 0;
          local_3f8._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_408,pbStack_3b0,local_360);
        }
        std::__cxx11::string::substr((ulong)&local_3d8,(ulong)&local_448);
        std::__cxx11::string::operator=((string *)&local_448,(string *)&local_3d8);
        if ((long *)CONCAT44(uStack_3d4,local_3d8) != local_3c8) {
          operator_delete((long *)CONCAT44(uStack_3d4,local_3d8),local_3c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_allocated_capacity != &local_3f8) {
          operator_delete((void *)local_408._M_allocated_capacity,
                          CONCAT71(local_3f8._M_allocated_capacity._1_7_,local_3f8._M_local_buf[0])
                          + 1);
        }
        bVar4 = cmsys::SystemTools::FileIsFullPath(local_448._M_dataplus._M_p);
        if (!bVar4) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_408,&local_468,&local_448);
          std::__cxx11::string::operator=((string *)&local_448,(string *)local_408._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_allocated_capacity != &local_3f8) {
            operator_delete((void *)local_408._M_allocated_capacity,
                            CONCAT71(local_3f8._M_allocated_capacity._1_7_,local_3f8._M_local_buf[0]
                                    ) + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3e0,&local_448);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,
                          CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                                   local_448.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_300 != (char *)0x0) {
        operator_delete__(local_300);
      }
      if (local_180 != (char *)0x0) {
        operator_delete__(local_180);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,
                        CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                 local_468.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((pointer)local_428._0_8_ == (pointer)(local_428 + 0x10)) {
      return bVar2;
    }
  }
  else {
    if (rccCommand->_M_string_length == 0) {
      cmSystemTools::Error
                ("AutoRcc: Error: rcc executable not available\n",(char *)0x0,(char *)0x0,
                 (char *)0x0);
      return false;
    }
    local_428._0_8_ = (pointer)0x0;
    local_428._8_8_ = (pointer)0x0;
    local_428._16_8_ = (pointer)0x0;
    local_3e8 = errorMessage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_428,rccCommand);
    local_228._M_allocated_capacity._0_4_ = 0x65682d2d;
    local_228._M_allocated_capacity._4_2_ = 0x706c;
    local_230 = (char *)0x6;
    local_228._M_local_buf[6] = '\0';
    local_238 = (undefined1  [8])&local_228;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_428,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    if (local_238 != (undefined1  [8])&local_228) {
      operator_delete((void *)local_238,
                      CONCAT17(local_228._M_local_buf[7],
                               CONCAT16(local_228._M_local_buf[6],
                                        CONCAT24(local_228._M_allocated_capacity._4_2_,
                                                 local_228._M_allocated_capacity._0_4_))) + 1);
    }
    local_230 = (char *)0x0;
    local_228._M_allocated_capacity._0_4_ = local_228._M_allocated_capacity._0_4_ & 0xffffff00;
    local_3b8 = (undefined1  [8])local_3a8;
    pbStack_3b0 = (pointer)0x0;
    local_3a8[0]._M_allocated_capacity = local_3a8[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_468._M_dataplus._M_p = (pointer)((ulong)local_468._M_dataplus._M_p._4_4_ << 0x20);
    local_238 = (undefined1  [8])&local_228;
    bVar2 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_428,(string *)local_238,(string *)local_3b8,(int *)&local_468,
                       (char *)0x0,OUTPUT_NONE,0.0,Auto);
    if (bVar2 && (int)local_468._M_dataplus._M_p == 0) {
      lVar6 = std::__cxx11::string::find(local_238,0x583cac,0);
      __s = "-list";
      if (lVar6 != -1) {
        __s = "--list";
      }
    }
    else {
      __s = "-list";
    }
    if (local_3b8 != (undefined1  [8])local_3a8) {
      operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
    }
    if (local_238 != (undefined1  [8])&local_228) {
      operator_delete((void *)local_238,
                      CONCAT17(local_228._M_local_buf[7],
                               CONCAT16(local_228._M_local_buf[6],
                                        CONCAT24(local_228._M_allocated_capacity._4_2_,
                                                 local_228._M_allocated_capacity._0_4_))) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_428);
    local_3d8 = 0;
    local_428._0_8_ = local_428 + 0x10;
    local_428._8_8_ = (pointer)0x0;
    local_428._16_8_ = local_428._16_8_ & 0xffffffffffffff00;
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    local_468._M_string_length = 0;
    local_468.field_2._M_local_buf[0] = '\0';
    local_3a8[0]._M_allocated_capacity = 0;
    local_3b8 = (undefined1  [8])0x0;
    pbStack_3b0 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b8,rccCommand);
    local_238 = (undefined1  [8])&local_228;
    sVar7 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,__s,__s + sVar7);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    if (local_238 != (undefined1  [8])&local_228) {
      operator_delete((void *)local_238,
                      CONCAT17(local_228._M_local_buf[7],
                               CONCAT16(local_228._M_local_buf[6],
                                        CONCAT24(local_228._M_allocated_capacity._4_2_,
                                                 local_228._M_allocated_capacity._0_4_))) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b8,fileName);
    bVar2 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3b8,(string *)local_428,&local_468,&local_3d8,(char *)0x0,
                       OUTPUT_NONE,0.0,Auto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3b8);
    this = local_3e8;
    if (bVar2 && local_3d8 == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_238,(string *)local_428,_S_in);
      local_3b8 = (undefined1  [8])local_3a8;
      pbStack_3b0 = (pointer)0x0;
      local_3a8[0]._M_allocated_capacity = local_3a8[0]._M_allocated_capacity & 0xffffffffffffff00;
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)((long)local_238 + -0x18) +
                                (char)(istringstream *)local_238);
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)local_3b8,cVar3);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
        utilStripCR(&local_448,(string *)local_3b8);
        std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_448);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,
                          CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                                   local_448.field_2._M_local_buf[0]) + 1);
        }
        if (pbStack_3b0 != (pointer)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3e0,(string *)local_3b8);
        }
      }
      if (local_3b8 != (undefined1  [8])local_3a8) {
        operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_238);
      std::ios_base::~ios_base(local_1c0);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_238,(string *)&local_468,_S_in);
      local_448._M_string_length = 0;
      local_448.field_2._M_local_buf[0] = '\0';
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      do {
        do {
          cVar3 = std::ios::widen((char)*(undefined8 *)((long)local_238 + -0x18) +
                                  (char)(istream *)local_238);
          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)&local_448,cVar3);
          bVar2 = ((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0;
          if (bVar2) goto LAB_00455300;
          utilStripCR((string *)local_3b8,&local_448);
          std::__cxx11::string::operator=((string *)&local_448,(string *)local_3b8);
          if (local_3b8 != (undefined1  [8])local_3a8) {
            operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
          }
          iVar5 = strncmp(local_448._M_dataplus._M_p,"RCC: Error in",0xd);
        } while (iVar5 != 0);
        if ((RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
             ::searchString_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
                                         ::searchString_abi_cxx11_), iVar5 != 0)) {
          RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
          ::searchString_abi_cxx11_ = &DAT_00692328;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
                      ::searchString_abi_cxx11_,"Cannot find file \'","");
          __cxa_atexit(std::__cxx11::string::~string,
                       &RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
                        ::searchString_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
                               ::searchString_abi_cxx11_);
        }
        lVar6 = std::__cxx11::string::find
                          ((char *)&local_448,
                           (ulong)RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
                                  ::searchString_abi_cxx11_,0);
        if (lVar6 == -1) {
          if (local_3e8 != (string *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b8,"AutoRcc: Error: Rcc lists unparsable output:\n",0x2d);
            Quoted((string *)&local_408,&local_448);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_3b8,(char *)local_408._M_allocated_capacity,
                                local_408._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_allocated_capacity != &local_3f8) {
              operator_delete((void *)local_408._M_allocated_capacity,
                              CONCAT71(local_3f8._M_allocated_capacity._1_7_,
                                       local_3f8._M_local_buf[0]) + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)local_3e8,(string *)local_408._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_allocated_capacity != &local_3f8) {
              operator_delete((void *)local_408._M_allocated_capacity,
                              CONCAT71(local_3f8._M_allocated_capacity._1_7_,
                                       local_3f8._M_local_buf[0]) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
            std::ios_base::~ios_base(local_348);
          }
        }
        else {
          std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_448);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_3e0,(string *)local_3b8);
          if (local_3b8 != (undefined1  [8])local_3a8) {
            operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
          }
        }
      } while (lVar6 != -1);
LAB_00455300:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,
                        CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                                 local_448.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_238);
      std::ios_base::~ios_base(local_1c0);
    }
    else {
      if (local_3e8 != (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,"AutoRcc: Error: Rcc list process for ",0x25);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_238,(fileName->_M_dataplus)._M_p,
                            fileName->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," failed:\n",9);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)local_428._0_8_,local_428._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_468._M_dataplus._M_p,local_468._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)this,(string *)local_3b8);
        if (local_3b8 != (undefined1  [8])local_3a8) {
          operator_delete((void *)local_3b8,local_3a8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        std::ios_base::~ios_base(local_1c8);
      }
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,
                      CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                               local_468.field_2._M_local_buf[0]) + 1);
    }
    if ((pointer)local_428._0_8_ == (pointer)(local_428 + 0x10)) {
      return bVar2;
    }
  }
  operator_delete((void *)local_428._0_8_,(ulong)(local_428._16_8_ + 1));
  return bVar2;
}

Assistant:

bool cmQtAutoGeneratorCommon::RccListInputs(const std::string& qtMajorVersion,
                                            const std::string& rccCommand,
                                            const std::string& fileName,
                                            std::vector<std::string>& files,
                                            std::string* errorMessage)
{
  bool allGood = false;
  if (cmsys::SystemTools::FileExists(fileName.c_str())) {
    if (qtMajorVersion == "4") {
      allGood = RccListInputsQt4(fileName, files, errorMessage);
    } else {
      allGood = RccListInputsQt5(rccCommand, fileName, files, errorMessage);
    }
  } else {
    if (errorMessage != CM_NULLPTR) {
      std::ostringstream ost;
      ost << "AutoRcc: Error: Rcc file does not exist:\n"
          << cmQtAutoGeneratorCommon::Quoted(fileName) << "\n";
      *errorMessage = ost.str();
    }
  }
  return allGood;
}